

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

string * __thiscall
ICM::Instruction::Insts::JumpCompare::getToString_abi_cxx11_
          (string *__return_storage_ptr__,JumpCompare *this)

{
  string local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  JumpCompare *local_18;
  JumpCompare *this_local;
  
  local_18 = this;
  this_local = (JumpCompare *)__return_storage_ptr__;
  Compare::getToString_abi_cxx11_(&local_78,&this->super_Compare);
  std::operator+(&local_58,&local_78,", {");
  std::__cxx11::to_string(&local_a8,this->Index);
  std::operator+(&local_38,&local_58,&local_a8);
  std::operator+(__return_storage_ptr__,&local_38,"}");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

string getToString() const { return  Compare::getToString() + ", {" + std::to_string(Index) + "}"; }